

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall
binlog::SessionWriter::
addEvent<int*&,std::unique_ptr<int,std::default_delete<int>>&,std::shared_ptr<int>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,int **args,
          unique_ptr<int,_std::default_delete<int>_> *args_1,shared_ptr<int> *args_2)

{
  undefined1 uVar1;
  size_t in_RDX;
  SessionWriter *in_RSI;
  size_t totalSize;
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [5];
  size_t sizes [5];
  size_t size;
  QueueWriter *in_stack_fffffffffffffee8;
  QueueWriter *ostream;
  int **in_stack_fffffffffffffef0;
  shared_ptr<int> *in;
  size_t in_stack_ffffffffffffff08;
  undefined4 *puVar2;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  long local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  long local_68 [5];
  long local_40 [4];
  
  local_40[0] = 0;
  local_68[0] = 8;
  local_68[1] = 8;
  local_68[2] = mserialize::serialized_size<int*>((int **)0x10c412);
  local_68[3] = mserialize::serialized_size<std::unique_ptr<int,std::default_delete<int>>>
                          ((unique_ptr<int,_std::default_delete<int>_> *)0x10c440);
  local_68[4] = mserialize::serialized_size<std::shared_ptr<int>>((shared_ptr<int> *)0x10c46e);
  local_80 = local_40;
  local_70 = local_68;
  for (local_78 = local_70; local_78 != local_80; local_78 = local_78 + 1) {
    local_88 = *local_78;
    local_40[0] = local_88 + local_40[0];
  }
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_40[0] + 4);
  uVar1 = detail::QueueWriter::beginWrite
                    ((QueueWriter *)
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                     in_stack_ffffffffffffff08);
  if (!(bool)uVar1) {
    replaceChannel(in_RSI,in_RDX);
    in_stack_ffffffffffffff16 =
         detail::QueueWriter::beginWrite
                   ((QueueWriter *)
                    CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
                    in_stack_ffffffffffffff08);
    if (!(bool)in_stack_ffffffffffffff16) {
      return false;
    }
  }
  mserialize::serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  puVar2 = &local_a4;
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            ((unsigned_long *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *puVar2 = 0;
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            ((unsigned_long *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_a0 = 0;
  mserialize::serialize<int*,binlog::detail::QueueWriter>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_9c = 0;
  in = (shared_ptr<int> *)local_98;
  mserialize::serialize<std::unique_ptr<int,std::default_delete<int>>,binlog::detail::QueueWriter>
            ((unique_ptr<int,_std::default_delete<int>_> *)in,in_stack_fffffffffffffee8);
  *(undefined4 *)
   &(((__uniq_ptr_impl<int,_std::default_delete<int>_> *)
     &(in->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_M_t).
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = 0;
  ostream = (QueueWriter *)(local_98 + 4);
  mserialize::serialize<std::shared_ptr<int>,binlog::detail::QueueWriter>(in,ostream);
  *(undefined4 *)&ostream->_queue = 0;
  detail::QueueWriter::endWrite
            ((QueueWriter *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}